

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::genPointerArrays
          (CppGenerator *this,string *rel,string *numOfJoinVars,bool parallelizeRelation)

{
  string *in_RDI;
  byte in_R8B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  string local_4d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  CppGenerator *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [39];
  byte local_21;
  
  local_21 = in_R8B & 1;
  if (local_21 == 0) {
    pbVar1 = &local_4b8;
    offset_abi_cxx11_(in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
    std::operator+(in_stack_fffffffffffffb08,(char *)pbVar1);
    std::operator+(in_stack_fffffffffffffb08,pbVar1);
    std::operator+(in_stack_fffffffffffffb08,(char *)pbVar1);
    std::operator+(in_stack_fffffffffffffb08,pbVar1);
    std::operator+(in_stack_fffffffffffffb08,(char *)pbVar1);
    std::operator+(in_stack_fffffffffffffb08,(char *)pbVar1);
    std::operator+(in_stack_fffffffffffffb08,pbVar1);
    std::operator+(in_stack_fffffffffffffb08,(char *)pbVar1);
    std::operator+(in_stack_fffffffffffffb08,pbVar1);
    std::operator+(in_stack_fffffffffffffb08,(char *)pbVar1);
    offset_abi_cxx11_(in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    std::operator+(in_stack_fffffffffffffb08,(char *)pbVar1);
    std::operator+(in_stack_fffffffffffffb08,pbVar1);
    std::operator+(in_stack_fffffffffffffb08,(char *)pbVar1);
    std::operator+(in_stack_fffffffffffffb08,pbVar1);
    std::operator+(in_stack_fffffffffffffb08,(char *)pbVar1);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::string::~string(local_2f8);
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::~string(local_338);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::string::~string(local_4d8);
    std::__cxx11::string::~string(local_378);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_3b8);
    std::__cxx11::string::~string(local_3d8);
    std::__cxx11::string::~string(local_3f8);
    std::__cxx11::string::~string(local_418);
    std::__cxx11::string::~string(local_438);
    std::__cxx11::string::~string(local_458);
    std::__cxx11::string::~string(local_478);
    std::__cxx11::string::~string(local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
  }
  else {
    pbVar1 = &local_268;
    offset_abi_cxx11_(in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffb00);
    std::operator+(pbVar1,in_stack_fffffffffffffb00);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffb00);
    std::operator+(pbVar1,in_stack_fffffffffffffb00);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffb00);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffb00);
    std::operator+(pbVar1,in_stack_fffffffffffffb00);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffb00);
    std::operator+(pbVar1,in_stack_fffffffffffffb00);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffb00);
    offset_abi_cxx11_(in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffb00);
    std::operator+(pbVar1,in_stack_fffffffffffffb00);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffb00);
    offset_abi_cxx11_(in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffb00);
    std::operator+(pbVar1,in_stack_fffffffffffffb00);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffb00);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string((string *)&local_268);
  }
  return in_RDI;
}

Assistant:

std::string CppGenerator::genPointerArrays(const std::string& rel,
                                           std::string& numOfJoinVars,
                                           bool parallelizeRelation)
{
    if (parallelizeRelation)
        return offset(2)+"size_t lowerptr_"+rel+"["+numOfJoinVars+"] = {}, "+
            "upperptr_"+rel+"["+numOfJoinVars+"] = {}; \n"+
            offset(2)+"upperptr_"+rel+"[0] = upperptr;\n"+
            offset(2)+"lowerptr_"+rel+"[0] = lowerptr;\n";
    else
        return offset(2)+"size_t lowerptr_"+rel+"["+numOfJoinVars+"] = {}, "+
            "upperptr_"+rel+"["+numOfJoinVars+"] = {}; \n"+
            offset(2)+"upperptr_"+rel+"[0] = "+rel+".size()-1;\n";
}